

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O2

void __thiscall Js::LdLenInfo::Merge(LdLenInfo *this,LdLenInfo *other)

{
  ValueType valueType;
  bool bVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a [4];
  ValueType merged;
  
  valueType.field_0 =
       (anon_union_2_4_ea848c7b_for_ValueType_13)
       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(other->arrayType).field_0.field_0;
  ValueType::Verify((ValueType)
                    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this->arrayType).field_0.field_0)
  ;
  ValueType::Verify(valueType);
  bVar1 = ValueType::operator==(&this->arrayType,valueType);
  if (bVar1) {
    aVar2.field_0 =
         *(anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
          &(this->arrayType).field_0;
  }
  else {
    ValueType::ValueType
              ((ValueType *)&local_2a[0].field_0,
               (this->arrayType).field_0.bits | (ushort)valueType.field_0);
    bVar1 = ValueType::OneOn((ValueType *)&local_2a[0].field_0,Object);
    if (bVar1) {
      aVar2.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::MergeWithObject(&this->arrayType,valueType);
    }
    else {
      aVar2.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::Verify(local_2a[0].field_0);
    }
  }
  (this->arrayType).field_0 = aVar2;
  (this->field_1).bits = (this->field_1).bits | (other->field_1).bits;
  return;
}

Assistant:

void Merge(const LdLenInfo & other)
        {
            arrayType = arrayType.Merge(other.arrayType);
            bits |= other.bits;
        }